

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

Aig_Man_t *
Saig_ManUnrollWithCex(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,Vec_Int_t **pvMapPiF2A)

{
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Vec_Vec_t *p;
  Vec_Vec_t *p_00;
  Aig_Obj_t *pAVar7;
  Vec_Int_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Man_t *p_01;
  char *pcVar10;
  void *pvVar11;
  Aig_Obj_t *pAVar12;
  ulong uVar13;
  Aig_Obj_t *p1;
  int iVar14;
  int iVar15;
  
  if (pAig->nTruePis != pCex->nPis) {
    __assert_fail("Saig_ManPiNum(pAig) == pCex->nPis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x111,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  if (pAig->nRegs != pCex->nRegs) {
    __assert_fail("Saig_ManRegNum(pAig) == pCex->nRegs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x112,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  if ((pCex->iPo < 0) || (pAig->nTruePos <= pCex->iPo)) {
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x113,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  pVVar6 = Vec_IntAlloc(1000);
  *pvMapPiF2A = pVVar6;
  p = Vec_VecStart(pCex->iFrame + 1);
  p_00 = Vec_VecStart(pCex->iFrame + 1);
  pAVar7 = Aig_ManCo(pAig,pCex->iPo);
  Vec_VecPushInt(p,pCex->iFrame,pAVar7->Id);
  iVar2 = pCex->iFrame;
  while (iVar15 = iVar2, -1 < iVar15) {
    Aig_ManIncrementTravId(pAig);
    pVVar6 = Vec_VecEntryInt(p,iVar15);
    for (iVar14 = 0; iVar2 = iVar15 + -1, iVar14 < pVVar6->nSize; iVar14 = iVar14 + 1) {
      iVar2 = Vec_IntEntry(pVVar6,iVar14);
      pAVar7 = Aig_ManObj(pAig,iVar2);
      pVVar8 = Vec_VecEntryInt(p_00,iVar15);
      if (iVar15 == 0) {
        pVVar9 = (Vec_Ptr_t *)0x0;
      }
      else {
        pVVar9 = Vec_VecEntry(p,iVar15 + -1);
      }
      Saig_ManUnrollCollect_rec(pAig,pAVar7,pVVar8,(Vec_Int_t *)pVVar9);
    }
  }
  p_01 = Aig_ManStart(10000);
  pcVar10 = Abc_UtilStrsav(pAig->pName);
  p_01->pName = pcVar10;
  pcVar10 = Abc_UtilStrsav(pAig->pSpec);
  p_01->pSpec = pcVar10;
  uVar13 = 0;
  while (uVar4 = (uint)uVar13, (int)uVar4 < pAig->nRegs) {
    pvVar11 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + uVar4);
    *(ulong *)((long)pvVar11 + 0x28) =
         (ulong)(((uint)(&pCex[1].iPo)[uVar13 >> 5] >> (uVar4 & 0x1f) & 1) == 0) ^
         (ulong)p_01->pConst1;
    uVar13 = (ulong)(uVar4 + 1);
  }
  for (iVar2 = 0; iVar2 <= pCex->iFrame; iVar2 = iVar2 + 1) {
    pVVar6 = Vec_VecEntryInt(p_00,iVar2);
    for (iVar15 = 0; iVar15 < pVVar6->nSize; iVar15 = iVar15 + 1) {
      iVar14 = Vec_IntEntry(pVVar6,iVar15);
      pAVar7 = Aig_ManObj(pAig,iVar14);
      uVar4 = (uint)*(undefined8 *)&pAVar7->field_0x18;
      if ((uVar4 & 7) - 7 < 0xfffffffe) {
        if ((uVar4 & 7) == 3) {
          pAVar12 = Aig_ObjChild0Copy(pAVar7);
          goto LAB_004a9e37;
        }
        iVar14 = Aig_ObjIsConst1(pAVar7);
        if (iVar14 != 0) {
          pAVar12 = p_01->pConst1;
          goto LAB_004a9e37;
        }
        if (((*(uint *)&pAVar7->field_0x18 & 7) == 2) &&
           (iVar14 = Aig_ObjCioId(pAVar7), iVar14 < pAig->nTruePis)) {
          iVar14 = Aig_ObjCioId(pAVar7);
          if (iVar14 < nInputs) {
            iVar14 = pCex->nPis;
            iVar5 = pCex->nRegs;
            iVar3 = Aig_ObjCioId(pAVar7);
            uVar4 = iVar3 + iVar14 * iVar2 + iVar5;
            (pAVar7->field_5).pData =
                 (void *)((ulong)(((uint)(&pCex[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) == 0
                                 ) ^ (ulong)p_01->pConst1);
          }
          else {
            pAVar12 = Aig_ObjCreateCi(p_01);
            (pAVar7->field_5).pData = pAVar12;
            pVVar8 = *pvMapPiF2A;
            iVar14 = Aig_ObjCioId(pAVar7);
            Vec_IntPush(pVVar8,iVar14);
            Vec_IntPush(*pvMapPiF2A,iVar2);
          }
        }
      }
      else {
        pAVar12 = Aig_ObjChild0Copy(pAVar7);
        if (((ulong)pAVar7 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
        }
        uVar13 = (ulong)pAVar7->pFanin1 & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)((ulong)((uint)pAVar7->pFanin1 & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        pAVar12 = Aig_And(p_01,pAVar12,p1);
LAB_004a9e37:
        (pAVar7->field_5).pData = pAVar12;
      }
    }
    if (iVar2 == pCex->iFrame) break;
    pVVar6 = Vec_VecEntryInt(p,iVar2);
    for (iVar15 = 0; iVar15 < pVVar6->nSize; iVar15 = iVar15 + 1) {
      iVar14 = Vec_IntEntry(pVVar6,iVar15);
      pAVar7 = Aig_ManObj(pAig,iVar14);
      if ((*(uint *)&pAVar7->field_0x18 & 7) != 3) {
LAB_004a9fea:
        __assert_fail("Saig_ObjIsLi(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                      ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
      }
      aVar1 = pAVar7->field_5;
      iVar14 = Aig_ObjCioId(pAVar7);
      if (iVar14 < pAig->nTruePos) goto LAB_004a9fea;
      pVVar9 = pAig->vCis;
      iVar14 = pAig->nTruePis;
      iVar5 = Aig_ObjCioId(pAVar7);
      pvVar11 = Vec_PtrEntry(pVVar9,(iVar14 + iVar5) - pAig->nTruePos);
      *(anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 *)((long)pvVar11 + 0x28) = aVar1;
    }
  }
  pAVar7 = Aig_ManCo(pAig,pCex->iPo);
  Aig_ObjCreateCo(p_01,(Aig_Obj_t *)((ulong)(pAVar7->field_5).pData ^ 1));
  Aig_ManSetRegNum(p_01,0);
  Vec_VecFree(p);
  Vec_VecFree(p_00);
  Aig_ManCleanup(p_01);
  return p_01;
}

Assistant:

Aig_Man_t * Saig_ManUnrollWithCex( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, Vec_Int_t ** pvMapPiF2A )
{
    Aig_Man_t * pFrames;     // unrolled timeframes
    Vec_Vec_t * vFrameCos;   // the list of COs per frame
    Vec_Vec_t * vFrameObjs;  // the list of objects per frame
    Vec_Int_t * vRoots, * vObjs;
    Aig_Obj_t * pObj;
    int i, f;
    // sanity checks
    assert( Saig_ManPiNum(pAig) == pCex->nPis );
    assert( Saig_ManRegNum(pAig) == pCex->nRegs );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );

    // map PIs of the unrolled frames into PIs of the original design
    *pvMapPiF2A = Vec_IntAlloc( 1000 );

    // collect COs and Objs visited in each frame
    vFrameCos  = Vec_VecStart( pCex->iFrame+1 );
    vFrameObjs = Vec_VecStart( pCex->iFrame+1 );
    // initialized the topmost frame
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Vec_VecPushInt( vFrameCos, pCex->iFrame, Aig_ObjId(pObj) );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManUnrollCollect_rec( pAig, pObj, 
                Vec_VecEntryInt(vFrameObjs, f),
                (Vec_Int_t *)(f ? Vec_VecEntry(vFrameCos, f-1) : NULL) );
    }

    // derive unrolled timeframes
    pFrames = Aig_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // initialize the flops 
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, i) );
    // iterate through the frames
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // construct
        vObjs = Vec_VecEntryInt( vFrameObjs, f );
        Aig_ManForEachObjVec( vObjs, pAig, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) )
                pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else if ( Aig_ObjIsCo(pObj) )
                pObj->pData = Aig_ObjChild0Copy(pObj);
            else if ( Aig_ObjIsConst1(pObj) )
                pObj->pData = Aig_ManConst1(pFrames);
            else if ( Saig_ObjIsPi(pAig, pObj) )
            {
                if ( Aig_ObjCioId(pObj) < nInputs )
                {
                    int iBit = pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj);
                    pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, iBit) );
                }
                else
                {
                    pObj->pData = Aig_ObjCreateCi( pFrames );
                    Vec_IntPush( *pvMapPiF2A, Aig_ObjCioId(pObj) );
                    Vec_IntPush( *pvMapPiF2A, f );
                }
            }
        }
        if ( f == pCex->iFrame )
            break;
        // transfer
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ObjLiToLo( pAig, pObj )->pData = pObj->pData;
    }
    // create output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Aig_ObjCreateCo( pFrames, Aig_Not((Aig_Obj_t *)pObj->pData) );
    Aig_ManSetRegNum( pFrames, 0 );
    // cleanup
    Vec_VecFree( vFrameCos );
    Vec_VecFree( vFrameObjs );
    // finallize
    Aig_ManCleanup( pFrames );
    // return
    return pFrames;
}